

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O3

unsigned_long_long Jupiter_strtoull_nospace(char *str,int base)

{
  byte bVar1;
  int iVar2;
  unsigned_long_long uVar3;
  byte *pbVar4;
  
  if (*str == '+') {
    str = str + 1;
  }
  else if (*str == '-') {
    iVar2 = Jupiter_strtoi_nospace(str,base);
    return (long)iVar2;
  }
  pbVar4 = (byte *)str;
  if (base == 0x10) {
    base = 0x10;
    if (*str == 0x30) {
      if ((((byte *)str)[1] | 0x20) == 0x78) {
        pbVar4 = (byte *)str + 2;
      }
      else {
        pbVar4 = (byte *)str + 1;
      }
    }
    goto LAB_00127eb5;
  }
  if ((base != 0) || (base = 10, *str != 0x30)) goto LAB_00127eb5;
  pbVar4 = (byte *)str + 1;
  bVar1 = ((byte *)str)[1];
  base = 8;
  if (bVar1 < 0x62) {
    if (bVar1 == 0x42) {
LAB_00127ea4:
      base = 2;
      pbVar4 = (byte *)str + 2;
      goto LAB_00127eb5;
    }
    if (bVar1 != 0x58) goto LAB_00127eb5;
  }
  else {
    if (bVar1 == 0x62) goto LAB_00127ea4;
    if (bVar1 != 0x78) goto LAB_00127eb5;
  }
  base = 0x10;
  pbVar4 = (byte *)str + 2;
LAB_00127eb5:
  bVar1 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
          [*pbVar4];
  if ((int)(uint)bVar1 < base) {
    uVar3 = 0;
    do {
      pbVar4 = pbVar4 + 1;
      uVar3 = uVar3 * (uint)base + (ulong)bVar1;
      bVar1 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
              [*pbVar4];
    } while ((uint)bVar1 < (uint)base);
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

unsigned long long Jupiter_strtoull_nospace(const char *str, int base)
{
	unsigned long long total = 0;
	int tval;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
		++str;

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			switch (*++str)
			{
			case 'X':
			case 'x':
				++str;
				base = 16;
				break;
			case 'B':
			case 'b':
				++str;
				base = 2;
				break;
			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			++str;
			if (*str == 'x' || *str == 'X')
				++str;
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	return total;
}